

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O0

int arkRootCheck3(void *arkode_mem)

{
  double dVar1;
  undefined8 *puVar2;
  N_Vector in_RDI;
  sunrealtype unaff_retaddr;
  ARKodeRootMem rootmem;
  ARKodeMem ark_mem;
  int ier;
  int retval;
  int i;
  void *in_stack_00000038;
  int local_14;
  N_Vector dky;
  int in_stack_fffffffffffffffc;
  int iVar3;
  
  if (in_RDI == (N_Vector)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x26f,"arkRootCheck3",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                    ,"arkode_mem = NULL illegal.");
    iVar3 = -0x15;
  }
  else {
    puVar2 = (undefined8 *)in_RDI[0x29].content;
    dky = in_RDI;
    if (*(int *)(puVar2 + 0xc) == 2) {
      puVar2[5] = in_RDI[0x1f].ops;
      N_VScale(0x3ff0000000000000,in_RDI[0x18].sunctx,in_RDI[0x18].ops);
    }
    if (*(int *)(puVar2 + 0xc) == 1) {
      if (((double)puVar2[10] - (double)in_RDI[0x1f].ops) * (double)in_RDI[0x1d].ops < 0.0) {
        puVar2[5] = puVar2[10];
        ARKodeGetDky(rootmem,unaff_retaddr,in_stack_fffffffffffffffc,dky);
      }
      else {
        puVar2[5] = in_RDI[0x1f].ops;
        N_VScale(0x3ff0000000000000,in_RDI[0x18].sunctx,in_RDI[0x18].ops);
      }
    }
    iVar3 = (*(code *)*puVar2)(puVar2[5],in_RDI[0x18].ops,puVar2[8],puVar2[0x10]);
    puVar2[0xd] = puVar2[0xd] + 1;
    if (iVar3 == 0) {
      puVar2[0xb] = (ABS((double)in_RDI[0x1f].ops) + ABS((double)in_RDI[0x1d].ops)) *
                    (double)in_RDI->ops * 100.0;
      iVar3 = arkRootfind(in_stack_00000038);
      if (iVar3 == -0xc) {
        iVar3 = -0xc;
      }
      else {
        for (local_14 = 0; local_14 < *(int *)(puVar2 + 1); local_14 = local_14 + 1) {
          if ((*(int *)(puVar2[0xe] + (long)local_14 * 4) == 0) &&
             ((dVar1 = *(double *)(puVar2[9] + (long)local_14 * 8), dVar1 != 0.0 || (NAN(dVar1)))))
          {
            *(undefined4 *)(puVar2[0xe] + (long)local_14 * 4) = 1;
          }
        }
        puVar2[4] = puVar2[6];
        for (local_14 = 0; local_14 < *(int *)(puVar2 + 1); local_14 = local_14 + 1) {
          *(undefined8 *)(puVar2[7] + (long)local_14 * 8) =
               *(undefined8 *)(puVar2[9] + (long)local_14 * 8);
        }
        if (iVar3 == 0) {
          iVar3 = 0;
        }
        else {
          ARKodeGetDky(rootmem,unaff_retaddr,in_stack_fffffffffffffffc,dky);
          iVar3 = 1;
        }
      }
    }
    else {
      iVar3 = -0xc;
    }
  }
  return iVar3;
}

Assistant:

int arkRootCheck3(void* arkode_mem)
{
  int i, retval, ier;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  rootmem = ark_mem->root_mem;

  /* Set thi = tn or tout, whichever comes first; set y = y(thi). */
  if (rootmem->taskc == ARK_ONE_STEP)
  {
    rootmem->thi = ark_mem->tcur;
    N_VScale(ONE, ark_mem->yn, ark_mem->ycur);
  }
  if (rootmem->taskc == ARK_NORMAL)
  {
    if ((rootmem->toutc - ark_mem->tcur) * ark_mem->h >= ZERO)
    {
      rootmem->thi = ark_mem->tcur;
      N_VScale(ONE, ark_mem->yn, ark_mem->ycur);
    }
    else
    {
      rootmem->thi = rootmem->toutc;
      (void)ARKodeGetDky(ark_mem, rootmem->thi, 0, ark_mem->ycur);
    }
  }

  /* Set rootmem->ghi = g(thi) and call arkRootfind to search (tlo,thi) for roots. */
  retval = rootmem->gfun(rootmem->thi, ark_mem->ycur, rootmem->ghi,
                         rootmem->root_data);
  rootmem->nge++;
  if (retval != 0) { return (ARK_RTFUNC_FAIL); }

  rootmem->ttol = (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h)) *
                  ark_mem->uround * HUND;
  ier = arkRootfind(ark_mem);
  if (ier == ARK_RTFUNC_FAIL) { return (ARK_RTFUNC_FAIL); }
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (!rootmem->gactive[i] && rootmem->grout[i] != ZERO)
    {
      rootmem->gactive[i] = SUNTRUE;
    }
  }
  rootmem->tlo = rootmem->trout;
  for (i = 0; i < rootmem->nrtfn; i++) { rootmem->glo[i] = rootmem->grout[i]; }

  /* If no root found, return ARK_SUCCESS. */
  if (ier == ARK_SUCCESS) { return (ARK_SUCCESS); }

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void)ARKodeGetDky(ark_mem, rootmem->trout, 0, ark_mem->ycur);
  return (RTFOUND);
}